

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiContext * ImGui::CreateContext(_func_void_ptr_size_t *malloc_fn,_func_void_void_ptr *free_fn)

{
  ImGuiContext *this;
  
  if (malloc_fn == (_func_void_ptr_size_t *)0x0) {
    malloc_fn = malloc;
  }
  this = (ImGuiContext *)(*malloc_fn)(0x3aa0);
  ImGuiContext::ImGuiContext(this);
  (this->IO).MemAllocFn = malloc_fn;
  if (free_fn == (_func_void_void_ptr *)0x0) {
    free_fn = free;
  }
  (this->IO).MemFreeFn = free_fn;
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(void* (*malloc_fn)(size_t), void (*free_fn)(void*))
{
    if (!malloc_fn) malloc_fn = malloc;
    ImGuiContext* ctx = (ImGuiContext*)malloc_fn(sizeof(ImGuiContext));
    IM_PLACEMENT_NEW(ctx) ImGuiContext();
    ctx->IO.MemAllocFn = malloc_fn;
    ctx->IO.MemFreeFn = free_fn ? free_fn : free;
    return ctx;
}